

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::
Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
::eraseImpl(Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
            *this,size_t pos)

{
  StringPtr *pSVar1;
  size_t sVar2;
  StringPtr *pSVar3;
  size_t back;
  size_t pos_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  pSVar1 = Vector<kj::TreeMap<int,_kj::StringPtr>::Entry>::operator[]
                     ((Vector<kj::TreeMap<int,_kj::StringPtr>::Entry> *)this,pos);
  Impl<0UL,_false>::erase
            ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
             this,pos,pSVar1);
  sVar2 = Vector<kj::TreeMap<int,_kj::StringPtr>::Entry>::size
                    ((Vector<kj::TreeMap<int,_kj::StringPtr>::Entry> *)this);
  sVar2 = sVar2 - 1;
  if (pos != sVar2) {
    pSVar1 = Vector<kj::TreeMap<int,_kj::StringPtr>::Entry>::operator[]
                       ((Vector<kj::TreeMap<int,_kj::StringPtr>::Entry> *)this,sVar2);
    Impl<0UL,_false>::move
              ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
               this,sVar2,pos,pSVar1);
    pSVar1 = Vector<kj::TreeMap<int,_kj::StringPtr>::Entry>::operator[]
                       ((Vector<kj::TreeMap<int,_kj::StringPtr>::Entry> *)this,sVar2);
    pSVar1 = mv<kj::TreeMap<int,kj::StringPtr>::Entry>(pSVar1);
    pSVar3 = Vector<kj::TreeMap<int,_kj::StringPtr>::Entry>::operator[]
                       ((Vector<kj::TreeMap<int,_kj::StringPtr>::Entry> *)this,pos);
    (pSVar3->content).ptr = (pSVar1->content).ptr;
    (pSVar3->content).size_ = (pSVar1->content).size_;
    pSVar3[1].content.ptr = pSVar1[1].content.ptr;
  }
  Vector<kj::TreeMap<int,_kj::StringPtr>::Entry>::removeLast
            ((Vector<kj::TreeMap<int,_kj::StringPtr>::Entry> *)this);
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}